

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTxInReference::EstimateTxInVsize
          (ConfidentialTxInReference *this,AddressType addr_type,Script *redeem_script,bool is_blind
          ,int exponent,int minimum_bits,Script claim_script,Script *scriptsig_template)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  Script local_a0;
  Script local_68;
  
  witness_size = 0;
  no_witness_size = 0;
  Script::Script(&local_a0,redeem_script);
  Script::Script(&local_68,(Script *)claim_script._vptr_Script);
  EstimateTxInSize(this,addr_type,&local_a0,is_blind,exponent,minimum_bits,&local_68,
                   (Script *)
                   claim_script.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,&witness_size,&no_witness_size);
  Script::~Script(&local_68);
  Script::~Script(&local_a0);
  uVar1 = AbstractTransaction::GetVsizeFromSize(no_witness_size,witness_size);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTxInReference::EstimateTxInVsize(
    AddressType addr_type, Script redeem_script, bool is_blind, int exponent,
    int minimum_bits, Script claim_script,
    const Script *scriptsig_template) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  EstimateTxInSize(
      addr_type, redeem_script, is_blind, exponent, minimum_bits, claim_script,
      scriptsig_template, &witness_size, &no_witness_size);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}